

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

target_ulong exception_resume_pc_mips64el(CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = env->hflags;
  uVar2 = 0;
  if ((uVar1 & 0x87f800) != 0) {
    uVar2 = (ulong)(uVar1 >> 0xd & 2) | 0xfffffffffffffffc;
  }
  return uVar2 + ((ulong)(uVar1 >> 10 & 1) | (env->active_tc).PC);
}

Assistant:

target_ulong exception_resume_pc(CPUMIPSState *env)
{
    target_ulong bad_pc;
    target_ulong isa_mode;

    isa_mode = !!(env->hflags & MIPS_HFLAG_M16);
    bad_pc = env->active_tc.PC | isa_mode;
    if (env->hflags & MIPS_HFLAG_BMASK) {
        /*
         * If the exception was raised from a delay slot, come back to
         * the jump.
         */
        bad_pc -= (env->hflags & MIPS_HFLAG_B16 ? 2 : 4);
    }

    return bad_pc;
}